

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_clock.c
# Opt level: O1

void mk_clock_sequential_init(mk_server *server)

{
  mk_clock_context *pmVar1;
  time_t tVar2;
  char *pcVar3;
  
  pmVar1 = (mk_clock_context *)calloc(1,0x58);
  server->clock_context = pmVar1;
  if (pmVar1 != (mk_clock_context *)0x0) {
    tVar2 = time((time_t *)0x0);
    pmVar1 = server->clock_context;
    pmVar1->monkey_init_time = tVar2;
    (pmVar1->log_current_time).len = 0x1c;
    (pmVar1->headers_preset).len = 0x7f;
    pcVar3 = (char *)calloc(1,0x80);
    pmVar1->header_time_buffers[0] = pcVar3;
    pcVar3 = (char *)calloc(1,0x80);
    server->clock_context->header_time_buffers[1] = pcVar3;
    pcVar3 = (char *)calloc(1,0x1e);
    server->clock_context->log_time_buffers[0] = pcVar3;
    pcVar3 = (char *)calloc(1,0x1e);
    server->clock_context->log_time_buffers[1] = pcVar3;
    tVar2 = time((time_t *)0x0);
    if (tVar2 != -1) {
      mk_clock_log_set_time(tVar2,server);
      mk_clock_headers_preset(tVar2,server);
      return;
    }
  }
  return;
}

Assistant:

void mk_clock_sequential_init(struct mk_server *server)
{
    server->clock_context = mk_mem_alloc_z(sizeof(struct mk_clock_context));

    if (server->clock_context == NULL) {
        return;
    }

    /* Time when monkey was started */
    server->clock_context->monkey_init_time = time(NULL);

    server->clock_context->log_current_time.len = LOG_TIME_BUFFER_SIZE - 2;
    server->clock_context->headers_preset.len = HEADER_PRESET_SIZE - 1;

    server->clock_context->header_time_buffers[0] = mk_mem_alloc_z(HEADER_PRESET_SIZE);
    server->clock_context->header_time_buffers[1] = mk_mem_alloc_z(HEADER_PRESET_SIZE);

    server->clock_context->log_time_buffers[0] = mk_mem_alloc_z(LOG_TIME_BUFFER_SIZE);
    server->clock_context->log_time_buffers[1] = mk_mem_alloc_z(LOG_TIME_BUFFER_SIZE);

    /* Set the time once */
    time_t cur_time = time(NULL);

    if (cur_time != ((time_t)-1)) {
        mk_clock_log_set_time(cur_time, server);
        mk_clock_headers_preset(cur_time, server);
    }
}